

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_rar5.c
# Opt level: O1

void test_read_format_rar5_compressed(void)

{
  long lVar1;
  int iVar2;
  wchar_t wVar3;
  uint uVar4;
  archive_conflict *a;
  char *v2;
  time_t tVar5;
  la_int64_t v2_00;
  la_ssize_t lVar6;
  long lVar7;
  int iVar8;
  archive_entry *ae;
  uint8_t buff [1200];
  archive_entry *local_4f0;
  undefined1 local_4e8 [1208];
  
  extract_reference_file("test_read_format_rar5_compressed.rar");
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'¢',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_read_support_filter_all((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'¢',(uint)(iVar2 == 0),"0 == archive_read_support_filter_all(a)",a);
  iVar2 = archive_read_support_format_all((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'¢',(uint)(iVar2 == 0),"0 == archive_read_support_format_all(a)",a);
  wVar3 = archive_read_open_filename(a,"test_read_format_rar5_compressed.rar",0x2800);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'¢',(uint)(wVar3 == L'\0'),
                   "0 == archive_read_open_filename(a, \"test_read_format_rar5_compressed.rar\", 10240)"
                   ,a);
  iVar2 = archive_read_next_header((archive *)a,&local_4f0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'¤',(uint)(iVar2 == 0),"0 == archive_read_next_header(a, &ae)",a);
  v2 = archive_entry_pathname(local_4f0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
             ,L'¥',"test.bin","\"test.bin\"",v2,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(local_4f0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'¦',(uint)(0 < (int)tVar5),"(int) archive_entry_mtime(ae) > 0",a);
  v2_00 = archive_entry_size(local_4f0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                      ,L'§',0x4b0,"DATA_SIZE",v2_00,"archive_entry_size(ae)",(void *)0x0);
  lVar6 = archive_read_data((archive *)a,local_4e8,0x4b0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'¨',(uint)(lVar6 == 0x4b0),
                   "DATA_SIZE == archive_read_data(a, buff, DATA_SIZE)",a);
  iVar2 = archive_read_next_header((archive *)a,&local_4f0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'©',(uint)(iVar2 == 1),"ARCHIVE_EOF == archive_read_next_header(a, &ae)",a);
  iVar2 = 1;
  lVar1 = 0;
  do {
    lVar7 = lVar1;
    if (lVar7 == 0x4b0) break;
    iVar8 = (iVar2 + -3) * iVar2;
    if (iVar8 < 0) {
      iVar8 = -1;
    }
    uVar4 = i4le(local_4e8 + lVar7);
    iVar2 = iVar2 + 1;
    lVar1 = lVar7 + 4;
  } while (uVar4 == iVar8 + 1U);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ª',(uint)(lVar7 == 0x4b0),"1 == verify_data(buff, 0, DATA_SIZE)",a);
  iVar2 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                      ,L'¬',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",a);
  iVar2 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                      ,L'¬',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_rar5_compressed)
{
	const int DATA_SIZE = 1200;
	uint8_t buff[1200];

	PROLOGUE("test_read_format_rar5_compressed.rar");

	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualString("test.bin", archive_entry_pathname(ae));
	assertA((int) archive_entry_mtime(ae) > 0);
	assertEqualInt(DATA_SIZE, archive_entry_size(ae));
	assertA(DATA_SIZE == archive_read_data(a, buff, DATA_SIZE));
	assertA(ARCHIVE_EOF == archive_read_next_header(a, &ae));
	assertA(1 == verify_data(buff, 0, DATA_SIZE));

	EPILOGUE();
}